

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerScopedLdFld
          (Lowerer *this,Instr *ldFldInstr,JnHelperMethod helperMethod,bool withInlineCache)

{
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  intptr_t address;
  AddrOpnd *opndArg;
  Instr *pIVar3;
  Opnd *pOVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  PropertySymOpnd *pPVar7;
  IntConstOpnd *opndArg_00;
  intptr_t rootObject;
  Instr *instrPrev;
  Opnd *src;
  bool withInlineCache_local;
  JnHelperMethod helperMethod_local;
  Instr *ldFldInstr_local;
  Lowerer *this_local;
  
  if (!withInlineCache) {
    LoadScriptContext(this,ldFldInstr);
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  address = JITTimeFunctionBody::GetRootObject(this_00);
  opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,this->m_func,true,(Var)0x0);
  pIVar3 = LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,&opndArg->super_Opnd);
  pOVar4 = IR::Instr::UnlinkSrc1(ldFldInstr);
  bVar2 = IR::Opnd::IsSymOpnd(pOVar4);
  if (bVar2) {
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar4);
    bVar2 = Sym::IsPropertySym(pSVar6->m_sym);
    if (bVar2) goto LAB_0078c148;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x1af2,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as src");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_0078c148:
  LoadPropertySymAsArgument(this,ldFldInstr,pOVar4);
  if (withInlineCache) {
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar4);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1af7,"(src->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pPVar7 = IR::Opnd::AsPropertySymOpnd(pOVar4);
    opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar7->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,&opndArg_00->super_Opnd);
    pPVar7 = IR::Opnd::AsPropertySymOpnd(pOVar4);
    pOVar4 = LoadRuntimeInlineCacheOpnd(this,ldFldInstr,pPVar7,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,pOVar4);
    pOVar4 = LoadFunctionBodyOpnd(this,ldFldInstr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,pOVar4);
  }
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,ldFldInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedLdFld(IR::Instr * ldFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache)
{
    IR::Opnd *src;
    IR::Instr *instrPrev = ldFldInstr->m_prev;

    if(!withInlineCache)
    {
        LoadScriptContext(ldFldInstr);
    }

    intptr_t rootObject = m_func->GetJITFunctionBody()->GetRootObject();
    src = IR::AddrOpnd::New(rootObject, IR::AddrOpndKindDynamicVar, this->m_func, true);
    instrPrev = m_lowererMD.LoadHelperArgument(ldFldInstr, src);

    src = ldFldInstr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");
    this->LoadPropertySymAsArgument(ldFldInstr, src);

    if (withInlineCache)
    {
        AssertMsg(src->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");

        m_lowererMD.LoadHelperArgument(
            ldFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        // Not using the polymorphic inline cache because the fast path only uses the monomorphic inline cache
        this->m_lowererMD.LoadHelperArgument(ldFldInstr, this->LoadRuntimeInlineCacheOpnd(ldFldInstr, src->AsPropertySymOpnd()));

        m_lowererMD.LoadHelperArgument(ldFldInstr, LoadFunctionBodyOpnd(ldFldInstr));
    }
    m_lowererMD.ChangeToHelperCall(ldFldInstr, helperMethod);

    return instrPrev;
}